

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.h
# Opt level: O0

void __thiscall r_code::View::View(View *this)

{
  Atom *local_38;
  View *this_local;
  
  core::_Object::_Object(&this->super__Object);
  (this->super__Object)._vptr__Object = (_func_int **)&PTR__View_0014cb80;
  core::P<r_code::Code>::P(&this->object,(Code *)0x0);
  local_38 = (Atom *)&this->field_0x28;
  do {
    r_code::Atom::Atom(local_38,0xffffffff);
    local_38 = local_38 + 4;
  } while (local_38 != (Atom *)&this->field_0x5c);
  this->references[1] = (Code *)0x0;
  this->references[0] = (Code *)0x0;
  return;
}

Assistant:

View(): object(NULL)
    {
        references[0] = references[1] = NULL;
    }